

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFATests.cpp
# Opt level: O2

void __thiscall TestAnalysis::TestAnalysis(TestAnalysis *this,Symbol *symbol)

{
  slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::FlowAnalysisBase
            (&this->super_AbstractFlowAnalysis<TestAnalysis,_int>,symbol,
             (AnalysisOptions)(ZEXT412(0xffff) << 0x40),(Diagnostics *)0x0);
  return;
}

Assistant:

TestAnalysis(const Symbol& symbol) : AbstractFlowAnalysis(symbol, {}) {}